

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

void separate_host(char *lfname,char *host)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar5 = lfname + 1;
  cVar2 = lfname[1];
  pcVar4 = pcVar5;
  while (cVar2 != '}') {
    *host = cVar2;
    host = host + 1;
    pcVar1 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
    cVar2 = *pcVar1;
  }
  *host = '\0';
  if (pcVar4[2] == '\0') {
    *lfname = '<';
  }
  else {
    pcVar5 = pcVar4 + 1;
    uVar3 = (long)pcVar5 - (long)lfname;
    cVar2 = pcVar4[1];
    if (cVar2 != '\0') {
      if ((cVar2 == '<') || (cVar2 == '/')) {
        pcVar5 = pcVar4 + 2;
        uVar3 = uVar3 + 1;
        cVar2 = pcVar4[2];
      }
      do {
        pcVar5[-uVar3] = cVar2;
        cVar2 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
      } while (cVar2 != '\0');
    }
    if ((pcVar5[-1] == '>') && (pcVar5[-2] != '\'')) {
      pcVar5 = pcVar5 + ~uVar3;
    }
    else {
      pcVar5 = pcVar5 + -uVar3;
    }
  }
  *pcVar5 = '\0';
  return;
}

Assistant:

void separate_host(char *lfname, char *host)
#endif /* DOS */
{
  char *cp;
  ptrdiff_t diff;

  cp = lfname + 1; /* Skip the initial "{". */

  while (*cp != '}') *host++ = *cp++;
  *host = '\0';

  cp++; /* Now, *cp == '<' or drive letter. */
#ifdef DOS
  /* Check if there's a drive specified. */

  if (*(cp + 1) == DRIVESEP) {
    *drive = *cp; /* copy the drive letter, if there is one */
    cp++;
    cp++; /* Move to the real `<`/ */
  } else
    *drive = '\0'; /* no drive */
#endif             /* DOS */

  if (*(cp + 1) == '\0') {
    /* Root directory is specified. */
    *lfname = '<';
    *(lfname + 1) = '\0';
  } else {
    diff = cp - lfname;
    if (*cp == '<' || *cp == DIRSEP
#ifdef DOS
        || *cp == UNIXDIRSEP
#endif /* DOS */
        ) {
      /*
       * Skip the initial directory delimiter.
       */
      cp++;
      diff++;
    }
    while (*cp) {
      *(cp - diff) = *cp;
      cp++;
    }
    if (*(cp - 1) == '>' && *(cp - 2) != '\'') {
      /*
       * The last character is a not quoted directory
       * delimiter.  We have to remove it from the result
       * lfname for the convenience of unixpathname.
       */
      *(cp - diff - 1) = '\0';
    } else {
      *(cp - diff) = '\0';
    }
  }
}